

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O2

int TIFFAppendToStrip(TIFF *tif,uint32_t strip,uint8_t *data,tmsize_t cc)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  toff_t tVar5;
  void *p;
  ulong uVar6;
  long lVar7;
  tmsize_t tVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  char *pcVar11;
  uint64_t uVar12;
  toff_t tVar13;
  ulong uVar14;
  uint64_t uVar15;
  bool bVar16;
  toff_t local_50;
  
  uVar4 = tif->tif_curoff;
  if (uVar4 == 0) {
    tif->tif_lastvalidoff = 0;
    tVar13 = (tif->tif_dir).td_stripoffset_p[strip];
    bVar16 = tVar13 == 0;
LAB_0026f2fe:
    if ((tif->tif_dir).td_nstrips == 0) {
      __assert_fail("td->td_nstrips > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_write.c"
                    ,0x304,"int TIFFAppendToStrip(TIFF *, uint32_t, uint8_t *, tmsize_t)");
    }
    uVar4 = (tif->tif_dir).td_stripbytecount_p[strip];
    if ((uVar4 == 0) || (bVar16 || uVar4 < (ulong)cc)) {
      tVar13 = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
      puVar9 = (tif->tif_dir).td_stripoffset_p;
      puVar9[strip] = tVar13;
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x20;
      puVar10 = (tif->tif_dir).td_stripbytecount_p;
LAB_0026f380:
      tif->tif_curoff = tVar13;
      uVar12 = puVar10[strip];
      puVar10[strip] = 0;
      uVar4 = tif->tif_curoff;
      goto LAB_0026f397;
    }
    iVar3 = _TIFFSeekOK(tif,tVar13);
    if (iVar3 != 0) {
      puVar9 = (tif->tif_dir).td_stripoffset_p;
      puVar10 = (tif->tif_dir).td_stripbytecount_p;
      tif->tif_lastvalidoff = puVar10[strip] + puVar9[strip];
      tVar13 = puVar9[strip];
      goto LAB_0026f380;
    }
    uVar2 = tif->tif_row;
    pcVar11 = "Seek error at scanline %lu";
LAB_0026f5e6:
    TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar11,(ulong)uVar2);
  }
  else {
    puVar9 = (tif->tif_dir).td_stripoffset_p;
    if (puVar9[strip] == 0) {
      bVar16 = true;
      tVar13 = 0;
      goto LAB_0026f2fe;
    }
    uVar12 = 0xffffffffffffffff;
LAB_0026f397:
    uVar14 = uVar4 + cc & 0xffffffff;
    if ((tif->tif_flags & 0x80000) != 0) {
      uVar14 = uVar4 + cc;
    }
    if (uVar14 < uVar4 || uVar14 < (ulong)cc) {
LAB_0026f3b6:
      pcVar11 = "Maximum TIFF file size exceeded";
    }
    else {
      if (((tif->tif_lastvalidoff == 0) || (uVar14 <= tif->tif_lastvalidoff)) ||
         (uVar4 = (tif->tif_dir).td_stripbytecount_p[strip], uVar4 == 0)) {
LAB_0026f593:
        tVar8 = (*tif->tif_writeproc)(tif->tif_clientdata,data,cc);
        if (tVar8 == cc) {
          tif->tif_curoff = uVar14;
          puVar9 = (tif->tif_dir).td_stripbytecount_p;
          uVar15 = cc + puVar9[strip];
          puVar9[strip] = uVar15;
          if (uVar15 == uVar12) {
            return 1;
          }
          pbVar1 = (byte *)((long)&tif->tif_flags + 2);
          *pbVar1 = *pbVar1 | 0x20;
          return 1;
        }
        uVar2 = tif->tif_row;
        pcVar11 = "Write error at scanline %lu";
        goto LAB_0026f5e6;
      }
      uVar14 = 0x100000;
      if (uVar4 < 0x100000) {
        uVar14 = uVar4;
      }
      tVar13 = puVar9[strip];
      tVar5 = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
      if (((tif->tif_flags & 0x80000) == 0) && (cc + uVar4 + tVar5 >> 0x20 != 0)) goto LAB_0026f3b6;
      p = _TIFFmallocExt(tif,uVar14);
      if (p != (void *)0x0) {
        pbVar1 = (byte *)((long)&tif->tif_flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
        (tif->tif_dir).td_stripoffset_p[strip] = tVar5;
        (tif->tif_dir).td_stripbytecount_p[strip] = 0;
        local_50 = tVar5;
        for (lVar7 = 0; -lVar7 != uVar4; lVar7 = lVar7 - uVar14) {
          iVar3 = _TIFFSeekOK(tif,tVar13);
          if (iVar3 == 0) {
LAB_0026f564:
            pcVar11 = "Seek error";
LAB_0026f621:
            TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar11);
            _TIFFfreeExt(tif,p);
            return 0;
          }
          uVar6 = (*tif->tif_readproc)(tif->tif_clientdata,p,uVar14);
          if (uVar6 != uVar14) {
            pcVar11 = "Cannot read";
            goto LAB_0026f621;
          }
          iVar3 = _TIFFSeekOK(tif,local_50);
          if (iVar3 == 0) goto LAB_0026f564;
          uVar6 = (*tif->tif_writeproc)(tif->tif_clientdata,p,uVar14);
          if (uVar6 != uVar14) {
            pcVar11 = "Cannot write";
            goto LAB_0026f621;
          }
          tVar13 = tVar13 + uVar14;
          local_50 = local_50 + uVar14;
          puVar9 = (tif->tif_dir).td_stripbytecount_p + strip;
          *puVar9 = *puVar9 + uVar14;
        }
        _TIFFfreeExt(tif,p);
        uVar14 = (tVar5 + cc) - lVar7;
        goto LAB_0026f593;
      }
      pcVar11 = "No space for output buffer";
    }
    TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar11);
  }
  return 0;
}

Assistant:

static int TIFFAppendToStrip(TIFF *tif, uint32_t strip, uint8_t *data,
                             tmsize_t cc)
{
    static const char module[] = "TIFFAppendToStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t m;
    int64_t old_byte_count = -1;

    if (tif->tif_curoff == 0)
        tif->tif_lastvalidoff = 0;

    if (td->td_stripoffset_p[strip] == 0 || tif->tif_curoff == 0)
    {
        assert(td->td_nstrips > 0);

        if (td->td_stripbytecount_p[strip] != 0 &&
            td->td_stripoffset_p[strip] != 0 &&
            td->td_stripbytecount_p[strip] >= (uint64_t)cc)
        {
            /*
             * There is already tile data on disk, and the new tile
             * data we have will fit in the same space.  The only
             * aspect of this that is risky is that there could be
             * more data to append to this strip before we are done
             * depending on how we are getting called.
             */
            if (!SeekOK(tif, td->td_stripoffset_p[strip]))
            {
                TIFFErrorExtR(tif, module, "Seek error at scanline %lu",
                              (unsigned long)tif->tif_row);
                return (0);
            }

            tif->tif_lastvalidoff =
                td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip];
        }
        else
        {
            /*
             * Seek to end of file, and set that as our location to
             * write this strip.
             */
            td->td_stripoffset_p[strip] = TIFFSeekFile(tif, 0, SEEK_END);
            tif->tif_flags |= TIFF_DIRTYSTRIP;
        }

        tif->tif_curoff = td->td_stripoffset_p[strip];

        /*
         * We are starting a fresh strip/tile, so set the size to zero.
         */
        old_byte_count = td->td_stripbytecount_p[strip];
        td->td_stripbytecount_p[strip] = 0;
    }

    m = tif->tif_curoff + cc;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
        m = (uint32_t)m;
    if ((m < tif->tif_curoff) || (m < (uint64_t)cc))
    {
        TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
        return (0);
    }

    if (tif->tif_lastvalidoff != 0 && m > tif->tif_lastvalidoff &&
        td->td_stripbytecount_p[strip] > 0)
    {
        /* Ouch: we have detected that we are rewriting in place a strip/tile */
        /* with several calls to TIFFAppendToStrip(). The first call was with */
        /* a size smaller than the previous size of the strip/tile, so we */
        /* opted to rewrite in place, but a following call causes us to go */
        /* outsize of the strip/tile area, so we have to finally go for a */
        /* append-at-end-of-file strategy, and start by moving what we already
         */
        /* wrote. */
        tmsize_t tempSize;
        void *temp;
        uint64_t offsetRead;
        uint64_t offsetWrite;
        uint64_t toCopy = td->td_stripbytecount_p[strip];

        if (toCopy < 1024 * 1024)
            tempSize = (tmsize_t)toCopy;
        else
            tempSize = 1024 * 1024;

        offsetRead = td->td_stripoffset_p[strip];
        offsetWrite = TIFFSeekFile(tif, 0, SEEK_END);

        m = offsetWrite + toCopy + cc;
        if (!(tif->tif_flags & TIFF_BIGTIFF) && m != (uint32_t)m)
        {
            TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
            return (0);
        }

        temp = _TIFFmallocExt(tif, tempSize);
        if (temp == NULL)
        {
            TIFFErrorExtR(tif, module, "No space for output buffer");
            return (0);
        }

        tif->tif_flags |= TIFF_DIRTYSTRIP;

        td->td_stripoffset_p[strip] = offsetWrite;
        td->td_stripbytecount_p[strip] = 0;

        /* Move data written by previous calls to us at end of file */
        while (toCopy > 0)
        {
            if (!SeekOK(tif, offsetRead))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!ReadOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot read");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!SeekOK(tif, offsetWrite))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!WriteOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot write");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            offsetRead += tempSize;
            offsetWrite += tempSize;
            td->td_stripbytecount_p[strip] += tempSize;
            toCopy -= tempSize;
        }
        _TIFFfreeExt(tif, temp);

        /* Append the data of this call */
        offsetWrite += cc;
        m = offsetWrite;
    }

    if (!WriteOK(tif, data, cc))
    {
        TIFFErrorExtR(tif, module, "Write error at scanline %lu",
                      (unsigned long)tif->tif_row);
        return (0);
    }
    tif->tif_curoff = m;
    td->td_stripbytecount_p[strip] += cc;

    if ((int64_t)td->td_stripbytecount_p[strip] != old_byte_count)
        tif->tif_flags |= TIFF_DIRTYSTRIP;

    return (1);
}